

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::Y_formatter<spdlog::details::scoped_padder>::format
          (Y_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  scoped_padder p;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char acStack_4b [3];
  char *local_48;
  scoped_padder local_40;
  
  scoped_padder::scoped_padder(&local_40,4,&(this->super_flag_formatter).padinfo_,dest);
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar4 = fmt::v6::format_int::format_decimal((format_int *)&stack0xffffffffffffffa0,(ulong)uVar3);
  local_48 = pcVar4;
  if (iVar2 < -0x76c) {
    local_48 = pcVar4 + -1;
    pcVar4[-1] = '-';
  }
  lVar5 = (long)&stack0xffffffffffffffa0 - (long)local_48;
  if (-0x16 < lVar5) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_48,local_48 + lVar5 + 0x15);
    scoped_padder::~scoped_padder(&local_40);
    return;
  }
  fmt::v6::internal::assert_fail(in_stack_ffffffffffffffa0,0,in_stack_ffffffffffffff98);
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 4;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }